

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall tchecker::clockbounds::df_solver_t::~df_solver_t(df_solver_t *this)

{
  if (this->_L != (db_t *)0x0) {
    operator_delete__(this->_L);
  }
  if (this->_U != (db_t *)0x0) {
    operator_delete__(this->_U);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->_loc_pid).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

df_solver_t::~df_solver_t()
{
  delete[] _L;
  delete[] _U;
}